

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

unsigned_short __thiscall
bsim::quad_value_bit_vector::to_type<unsigned_short>(quad_value_bit_vector *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  quad_value_bit_vector *in_RDI;
  int i;
  unsigned_short exp;
  unsigned_short tmp;
  short sVar4;
  int iVar5;
  undefined4 local_10;
  undefined2 local_c;
  undefined2 local_a;
  
  local_a = 0;
  local_c = 1;
  local_10 = 0;
  while( true ) {
    iVar5 = local_10;
    iVar2 = bitLength(in_RDI);
    if (iVar2 <= iVar5) break;
    uVar3 = (uint)local_c;
    get((quad_value_bit_vector *)CONCAT44(iVar5,uVar3),0);
    sVar4 = (short)uVar3;
    bVar1 = quad_value::binary_value((quad_value *)in_RDI);
    local_a = local_a + sVar4 * (ushort)bVar1;
    local_c = local_c << 1;
    local_10 = local_10 + 1;
  }
  return local_a;
}

Assistant:

ConvType to_type() const {
      ConvType tmp = 0;
      ConvType exp = 1;
      for (int i = 0; i < bitLength(); i++) {
        tmp += exp*get(i).binary_value();
        exp *= 2;
      }
      return tmp;
      // ConvType tmp = *(const_cast<ConvType*>((const ConvType*) (&(bits[0]))));
      // //TODO FIXME I am a sketchy hack.
      // ConvType mask = sizeof(ConvType) > bits.size() ? (1<<N)-1 : -1; 
      // return tmp & mask;
    }